

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

void GetHostName(string *hostname)

{
  int iVar1;
  undefined1 local_196 [8];
  utsname buf;
  string *hostname_local;
  
  buf.domainname._57_8_ = hostname;
  iVar1 = uname((utsname *)local_196);
  if (iVar1 < 0) {
    buf.sysname[0x39] = '\0';
  }
  std::__cxx11::string::operator=((string *)buf.domainname._57_8_,buf.sysname + 0x39);
  return;
}

Assistant:

static void GetHostName(string* hostname) {
#if defined(HAVE_SYS_UTSNAME_H)
  struct utsname buf;
  if (uname(&buf) < 0) {
    // ensure null termination on failure
    *buf.nodename = '\0';
  }
  *hostname = buf.nodename;
#elif defined(GLOG_OS_WINDOWS)
  char buf[MAX_COMPUTERNAME_LENGTH + 1];
  DWORD len = MAX_COMPUTERNAME_LENGTH + 1;
  if (GetComputerNameA(buf, &len)) {
    *hostname = buf;
  } else {
    hostname->clear();
  }
#else
#  warning There is no way to retrieve the host name.
  *hostname = "(unknown)";
#endif
}